

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wallet.cpp
# Opt level: O0

bool __thiscall
wallet::CWallet::SetAddressBook
          (CWallet *this,CTxDestination *address,string *strName,
          optional<wallet::AddressPurpose> *purpose)

{
  long lVar1;
  bool bVar2;
  CWallet *in_RDI;
  long in_FS_OFFSET;
  WalletBatch batch;
  optional<wallet::AddressPurpose> *in_stack_00000060;
  string *in_stack_00000068;
  CTxDestination *in_stack_00000070;
  WalletBatch *in_stack_00000078;
  CWallet *in_stack_00000080;
  undefined7 in_stack_ffffffffffffff98;
  undefined1 in_stack_ffffffffffffff9f;
  WalletDatabase *in_stack_ffffffffffffffa0;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  GetDatabase(in_RDI);
  WalletBatch::WalletBatch
            ((WalletBatch *)in_RDI,in_stack_ffffffffffffffa0,(bool)in_stack_ffffffffffffff9f);
  bVar2 = SetAddressBookWithDB
                    (in_stack_00000080,in_stack_00000078,in_stack_00000070,in_stack_00000068,
                     in_stack_00000060);
  WalletBatch::~WalletBatch
            ((WalletBatch *)CONCAT17(in_stack_ffffffffffffff9f,in_stack_ffffffffffffff98));
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return bVar2;
  }
  __stack_chk_fail();
}

Assistant:

bool CWallet::SetAddressBook(const CTxDestination& address, const std::string& strName, const std::optional<AddressPurpose>& purpose)
{
    WalletBatch batch(GetDatabase());
    return SetAddressBookWithDB(batch, address, strName, purpose);
}